

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<boost::runtime::basic_param>::
shared_ptr<boost::runtime::parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0,true>>
          (shared_ptr<boost::runtime::basic_param> *this,
          parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true> *p)

{
  sp_counted_base *in_RSI;
  shared_count *in_RDI;
  parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true> *p_00;
  shared_ptr<boost::runtime::basic_param> *in_stack_ffffffffffffffe0;
  
  in_RDI->pi_ = in_RSI;
  p_00 = (parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true> *)
         (in_RDI + 1);
  detail::shared_count::shared_count((shared_count *)p_00);
  detail::
  sp_pointer_construct<boost::runtime::basic_param,boost::runtime::parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0,true>>
            (in_stack_ffffffffffffffe0,p_00,in_RDI);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }